

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<unsigned_long>
          (AsciiParser *this,char sep,char end_symbol,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *result)

{
  bool bVar1;
  allocator local_81;
  string local_80;
  uint64_t local_60;
  unsigned_long value_1;
  undefined1 local_50 [5];
  char nc;
  char c;
  uint64_t local_30;
  unsigned_long value;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *result_local;
  char end_symbol_local;
  AsciiParser *pAStack_18;
  char sep_local;
  AsciiParser *this_local;
  
  value = (unsigned_long)result;
  result_local._6_1_ = end_symbol;
  result_local._7_1_ = sep;
  pAStack_18 = this;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(result);
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (bVar1) {
    bVar1 = ReadBasicType(this,&local_30);
    if (bVar1) {
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)value,&local_30);
      while (bVar1 = Eof(this), ((bVar1 ^ 0xffU) & 1) != 0) {
        bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar1) {
          return false;
        }
        bVar1 = Char1(this,(char *)((long)&value_1 + 6));
        if (!bVar1) {
          return false;
        }
        if (value_1._6_1_ == result_local._7_1_) {
          bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar1) {
            return false;
          }
          bVar1 = LookChar1(this,(char *)((long)&value_1 + 5));
          if (!bVar1) {
            return false;
          }
          if (value_1._5_1_ == result_local._6_1_) break;
        }
        if (value_1._6_1_ != result_local._7_1_) {
          StreamReader::seek_from_current(this->_sr,-1);
          break;
        }
        bVar1 = SkipWhitespaceAndNewline(this,true);
        if (!bVar1) {
          return false;
        }
        bVar1 = ReadBasicType(this,&local_60);
        if (!bVar1) break;
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)value,&local_60);
      }
      bVar1 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)value);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_80,"Empty array.\n",&local_81);
        PushError(this,&local_80);
        ::std::__cxx11::string::~string((string *)&local_80);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_81);
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)local_50,"Not starting with the value of requested type.\n",
                 (allocator *)((long)&value_1 + 7));
      PushError(this,(string *)local_50);
      ::std::__cxx11::string::~string((string *)local_50);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&value_1 + 7));
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}